

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BitMatrix.cpp
# Opt level: O2

bool __thiscall ZXing::BitMatrix::getBottomRightOnBit(BitMatrix *this,int *right,int *bottom)

{
  pointer puVar1;
  int iVar2;
  pointer puVar3;
  int iVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  pointer puVar8;
  
  puVar3 = (this->_bits).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  puVar1 = (this->_bits).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_finish;
  lVar6 = (long)puVar1 - (long)puVar3;
  lVar5 = 0;
  for (lVar7 = lVar6 >> 2; iVar2 = (int)puVar1, 0 < lVar7; lVar7 = lVar7 + -1) {
    iVar4 = (int)lVar5;
    if (puVar1[lVar5 + -1] != '\0') {
      iVar4 = iVar4 + iVar2;
      goto LAB_0014d4c0;
    }
    if (puVar1[lVar5 + -2] != '\0') {
      iVar4 = iVar2 + iVar4 + -1;
      goto LAB_0014d4c0;
    }
    if (puVar1[lVar5 + -3] != '\0') {
      iVar4 = iVar2 + iVar4 + -2;
      goto LAB_0014d4c0;
    }
    if (puVar1[lVar5 + -4] != '\0') {
      iVar4 = iVar2 + iVar4 + -3;
      goto LAB_0014d4c0;
    }
    lVar5 = lVar5 + -4;
  }
  puVar8 = puVar1 + lVar5;
  lVar7 = lVar6 + lVar5;
  if (lVar7 != 1) {
    if (lVar7 == 3) {
      iVar4 = (int)puVar8;
      if (puVar8[-1] != '\0') goto LAB_0014d4c0;
      puVar8 = puVar1 + lVar5 + -1;
    }
    else {
      iVar4 = (int)puVar3;
      if (lVar7 != 2) goto LAB_0014d4c0;
    }
    iVar4 = (int)puVar8;
    if (puVar8[-1] != '\0') goto LAB_0014d4c0;
    puVar8 = puVar8 + -1;
  }
  if (puVar8[-1] != '\0') {
    puVar3 = puVar8;
  }
  iVar4 = (int)puVar3;
LAB_0014d4c0:
  iVar2 = ~(iVar2 - iVar4) + (int)lVar6;
  if (-1 < iVar2) {
    *bottom = iVar2 / this->_width;
    *right = iVar2 % this->_width;
  }
  return -1 < iVar2;
}

Assistant:

bool
BitMatrix::getBottomRightOnBit(int& right, int& bottom) const
{
	int bitsOffset = Size(_bits) - 1 - (int)std::distance(_bits.rbegin(), std::find_if(_bits.rbegin(), _bits.rend(), isSet));
	if (bitsOffset < 0) {
		return false;
	}

	bottom = bitsOffset / _width;
	right = (bitsOffset % _width);
	return true;
}